

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

buffer_appender<char>
fmt::v7::detail::write_char<char,fmt::v7::detail::buffer_appender<char>>
          (buffer_appender<char> out,char value,basic_format_specs<char> *specs)

{
  long lVar1;
  buffer_appender<char> bVar2;
  buffer<char> *buf;
  ulong uVar3;
  ulong n;
  
  uVar3 = 0;
  if ((ulong)(uint)specs->width != 0) {
    uVar3 = (ulong)(uint)specs->width - 1;
  }
  n = uVar3 >> (*(byte *)((long)&basic_data<void>::left_padding_shifts +
                         (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
  if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                0x18) <
      *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
               0x10) + (specs->fill).size_ * uVar3 + 1) {
    (*(code *)**(undefined8 **)
                out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
              (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
  }
  bVar2 = fill<fmt::v7::detail::buffer_appender<char>,char>(out,n,&specs->fill);
  if (*(ulong *)((long)bVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                0x18) <
      *(long *)((long)bVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
               0x10) + 1U) {
    (*(code *)**(undefined8 **)
                bVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
              (bVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
  }
  lVar1 = *(long *)((long)bVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                   + 0x10);
  *(long *)((long)bVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container + 0x10)
       = lVar1 + 1;
  *(char *)(*(long *)((long)bVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                            container + 8) + lVar1) = value;
  bVar2 = fill<fmt::v7::detail::buffer_appender<char>,char>(bVar2,uVar3 - n,&specs->fill);
  return (buffer_appender<char>)
         bVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
}

Assistant:

OutputIt write_char(OutputIt out, Char value,
                    const basic_format_specs<Char>& specs) {
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;
  return write_padded(out, specs, 1, [=](iterator it) {
    *it++ = value;
    return it;
  });
}